

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

void __thiscall
t_cpp_generator::generate_struct_print_method(t_cpp_generator *this,ostream *out,t_struct *tstruct)

{
  t_struct *ptVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  members_type *fields;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_40;
  t_struct *local_20;
  t_struct *tstruct_local;
  ostream *out_local;
  t_cpp_generator *this_local;
  
  local_20 = tstruct;
  tstruct_local = (t_struct *)out;
  out_local = (ostream *)this;
  t_generator::indent_abi_cxx11_(&local_40,(t_generator *)this);
  std::operator<<(out,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  generate_struct_print_method_decl(this,(ostream *)tstruct_local,local_20);
  poVar3 = std::operator<<((ostream *)tstruct_local," {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_70);
  poVar3 = std::operator<<(poVar3,"using ::apache::thrift::to_string;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_70);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_90);
  poVar3 = std::operator<<(poVar3,"out << \"");
  iVar2 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var,iVar2));
  poVar3 = std::operator<<(poVar3,"(\";");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_90);
  ptVar1 = tstruct_local;
  fields = t_struct::get_members(local_20);
  t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
  struct_ostream_operator_generator::generate_fields((ostream *)ptVar1,fields,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_d0);
  poVar3 = std::operator<<(poVar3,"out << \")\";");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_d0);
  t_generator::indent_down((t_generator *)this);
  poVar3 = std::operator<<((ostream *)tstruct_local,"}");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_cpp_generator::generate_struct_print_method(std::ostream& out, t_struct* tstruct) {
  out << indent();
  generate_struct_print_method_decl(out, tstruct);
  out << " {" << endl;

  indent_up();

  out << indent() << "using ::apache::thrift::to_string;" << endl;
  out << indent() << "out << \"" << tstruct->get_name() << "(\";" << endl;
  struct_ostream_operator_generator::generate_fields(out, tstruct->get_members(), indent());
  out << indent() << "out << \")\";" << endl;

  indent_down();
  out << "}" << endl << endl;
}